

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePrimalActivity
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *primal,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *activity,bool unscaled)

{
  int *piVar1;
  uint *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar9;
  Item *pIVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  undefined8 *puVar12;
  int iVar13;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  long lVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  type t;
  cpp_dec_float<50U,_int,_void> local_98;
  long local_58;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_50;
  
  iVar13 = (int)((ulong)((long)(primal->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(primal->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum != iVar13) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_98.data._M_elems._0_8_ = local_98.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "XSPXLP01 Primal vector for computing row activity has wrong dimension","");
    *puVar12 = &PTR__SPxException_0069d438;
    puVar12[1] = puVar12 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 1),local_98.data._M_elems._0_8_,
               local_98.data._M_elems._0_8_ + local_98.data._M_elems._8_8_);
    *puVar12 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(activity->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_98.data._M_elems._0_8_ = local_98.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "XSPXLP03 Activity vector computing row activity has wrong dimension","");
    *puVar12 = &PTR__SPxException_0069d438;
    puVar12[1] = puVar12 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 1),local_98.data._M_elems._0_8_,
               local_98.data._M_elems._0_8_ + local_98.data._M_elems._8_8_);
    *puVar12 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  uVar17 = 0;
  if ((0 < iVar13) &&
     (pcVar14 = &((primal->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend,
     pcVar14->fpclass != cpp_dec_float_NaN)) {
    lVar18 = 0x68;
    uVar19 = 0;
    do {
      uVar17 = uVar19;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_98,0,(type *)0x0);
      iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (pcVar14,&local_98);
      iVar13 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (iVar8 != 0) goto LAB_00226caf;
      uVar19 = uVar17 + 1;
      if ((long)iVar13 <= (long)uVar19) break;
      pnVar9 = (primal->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar14 = &pnVar9[uVar19].m_backend;
      piVar1 = (int *)((long)(pnVar9->m_backend).data._M_elems + lVar18);
      lVar18 = lVar18 + 0x38;
    } while (*piVar1 != 2);
    uVar17 = uVar17 + 1;
  }
LAB_00226caf:
  if ((int)uVar17 < iVar13) {
    iVar13 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memsize = 0;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_50._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
    local_50.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    iVar8 = 2;
    if (0 < iVar13) {
      iVar8 = iVar13;
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem(&local_50,iVar8);
    uVar19 = uVar17 & 0xffffffff;
    if ((unscaled) && (this->_isScaled == true)) {
      (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,uVar17 & 0xffffffff,&local_50);
      pnVar3 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar9 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar9 != pnVar3; pnVar9 = pnVar9 + 1
          ) {
        (pnVar9->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar9->m_backend).prec_elem = 10;
        (pnVar9->m_backend).data._M_elems[0] = 0;
        (pnVar9->m_backend).data._M_elems[1] = 0;
        (pnVar9->m_backend).data._M_elems[2] = 0;
        (pnVar9->m_backend).data._M_elems[3] = 0;
        (pnVar9->m_backend).data._M_elems[4] = 0;
        (pnVar9->m_backend).data._M_elems[5] = 0;
        (pnVar9->m_backend).data._M_elems[6] = 0;
        (pnVar9->m_backend).data._M_elems[7] = 0;
        *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x1d) = 0;
        *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x25) = 0;
      }
      if (0 < (long)local_50.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
        lVar18 = 0;
        do {
          iVar13 = *(int *)((long)(&(local_50.
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar18);
          pnVar9 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar9[iVar13].m_backend.data._M_elems + 8) =
               *(undefined8 *)
                ((long)((local_50.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem)->val).m_backend.data._M_elems + lVar18 + 0x20);
          puVar12 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar18);
          uVar4 = *puVar12;
          uVar6 = puVar12[1];
          puVar12 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar18 + 0x10);
          uVar7 = puVar12[1];
          puVar2 = pnVar9[iVar13].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = *puVar12;
          *(undefined8 *)(puVar2 + 2) = uVar7;
          *(undefined8 *)&pnVar9[iVar13].m_backend.data = uVar4;
          *(undefined8 *)(pnVar9[iVar13].m_backend.data._M_elems + 2) = uVar6;
          pnVar9[iVar13].m_backend.exp =
               *(int *)((long)(&((local_50.
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val).m_backend.data + 1) + lVar18);
          pnVar9[iVar13].m_backend.neg =
               *(bool *)((long)(&((local_50.
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val).m_backend.data + 1) + lVar18 + 4);
          uVar4 = *(undefined8 *)
                   ((long)(&((local_50.
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem)->val).m_backend.data + 1) + lVar18 + 8);
          pnVar9[iVar13].m_backend.fpclass = (int)uVar4;
          pnVar9[iVar13].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          lVar18 = lVar18 + 0x3c;
        } while ((long)local_50.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused * 0x3c - lVar18 != 0);
      }
    }
    else {
      pIVar10 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar19].idx;
      pnVar3 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar9 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar9 != pnVar3; pnVar9 = pnVar9 + 1
          ) {
        (pnVar9->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar9->m_backend).prec_elem = 10;
        (pnVar9->m_backend).data._M_elems[0] = 0;
        (pnVar9->m_backend).data._M_elems[1] = 0;
        (pnVar9->m_backend).data._M_elems[2] = 0;
        (pnVar9->m_backend).data._M_elems[3] = 0;
        (pnVar9->m_backend).data._M_elems[4] = 0;
        (pnVar9->m_backend).data._M_elems[5] = 0;
        (pnVar9->m_backend).data._M_elems[6] = 0;
        (pnVar9->m_backend).data._M_elems[7] = 0;
        *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x1d) = 0;
        *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x25) = 0;
      }
      if (0 < (pIVar10->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar18 = 0x38;
        lVar15 = 0;
        do {
          pNVar5 = (pIVar10->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          iVar13 = *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar18);
          pnVar9 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar9[iVar13].m_backend.data._M_elems + 8) =
               *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar18 + -0x18);
          puVar12 = (undefined8 *)((long)(&pNVar5->val + -1) + lVar18);
          uVar4 = *puVar12;
          uVar6 = puVar12[1];
          puVar12 = (undefined8 *)((long)(&(pNVar5->val).m_backend.data + -1) + lVar18);
          uVar7 = puVar12[1];
          puVar2 = pnVar9[iVar13].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = *puVar12;
          *(undefined8 *)(puVar2 + 2) = uVar7;
          *(undefined8 *)&pnVar9[iVar13].m_backend.data = uVar4;
          *(undefined8 *)(pnVar9[iVar13].m_backend.data._M_elems + 2) = uVar6;
          pnVar9[iVar13].m_backend.exp =
               *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar18 + -0x10);
          pnVar9[iVar13].m_backend.neg =
               *(bool *)((long)(pNVar5->val).m_backend.data._M_elems + lVar18 + -0xc);
          uVar4 = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar18 + -8);
          pnVar9[iVar13].m_backend.fpclass = (int)uVar4;
          pnVar9[iVar13].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          lVar15 = lVar15 + 1;
          lVar18 = lVar18 + 0x3c;
        } while (lVar15 < (pIVar10->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)activity,
                 (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19);
    if ((int)uVar17 + 1 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum) {
      lVar18 = uVar19 + 1;
      pcVar14 = &local_98;
      do {
        pnVar9 = (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58 = lVar18;
        if (pnVar9[lVar18].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00226f1c:
          if ((unscaled) && (this->_isScaled == true)) {
            (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,local_58,&local_50);
            lVar15 = (long)local_50.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar15) {
              pcVar20 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
              uVar17 = lVar15 + 1;
              lVar18 = lVar15 * 0x3c;
              do {
                pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)local_50.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar18);
                pcVar16 = pcVar11;
                if (pcVar11 == pcVar14) {
                  pcVar16 = pcVar20;
                }
                local_98.fpclass = cpp_dec_float_finite;
                local_98.prec_elem = 10;
                local_98.data._M_elems[0] = 0;
                local_98.data._M_elems[1] = 0;
                local_98.data._M_elems[2] = 0;
                local_98.data._M_elems[3] = 0;
                local_98.data._M_elems[4] = 0;
                local_98.data._M_elems[5] = 0;
                local_98.data._M_elems._24_5_ = 0;
                local_98.data._M_elems[7]._1_3_ = 0;
                local_98.data._M_elems._32_5_ = 0;
                local_98.data._M_elems[9]._1_3_ = 0;
                local_98.exp = 0;
                local_98.neg = false;
                if ((pcVar14 != pcVar20) && (pcVar11 != pcVar14)) {
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_98.data._M_elems._32_5_ = SUB85(uVar4,0);
                  local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_98.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_98.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_98.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_98.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_98.exp = pcVar20->exp;
                  local_98.neg = pcVar20->neg;
                  local_98.fpclass = pcVar20->fpclass;
                  local_98.prec_elem = pcVar20->prec_elem;
                  pcVar16 = pcVar11;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (pcVar14,pcVar16);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&local_50.
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar18)].m_backend,pcVar14);
                uVar17 = uVar17 - 1;
                lVar18 = lVar18 + -0x3c;
              } while (1 < uVar17);
            }
          }
          else {
            pIVar10 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem;
            iVar13 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[local_58].idx;
            lVar15 = (long)pIVar10[iVar13].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar15) {
              pcVar20 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
              pIVar10 = pIVar10 + iVar13;
              uVar17 = lVar15 + 1;
              lVar18 = lVar15 * 0x3c;
              do {
                pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(pIVar10->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar18);
                pcVar16 = pcVar11;
                if (pcVar11 == pcVar14) {
                  pcVar16 = pcVar20;
                }
                local_98.fpclass = cpp_dec_float_finite;
                local_98.prec_elem = 10;
                local_98.data._M_elems[0] = 0;
                local_98.data._M_elems[1] = 0;
                local_98.data._M_elems[2] = 0;
                local_98.data._M_elems[3] = 0;
                local_98.data._M_elems[4] = 0;
                local_98.data._M_elems[5] = 0;
                local_98.data._M_elems._24_5_ = 0;
                local_98.data._M_elems[7]._1_3_ = 0;
                local_98.data._M_elems._32_5_ = 0;
                local_98.data._M_elems[9]._1_3_ = 0;
                local_98.exp = 0;
                local_98.neg = false;
                if ((pcVar14 != pcVar20) && (pcVar11 != pcVar14)) {
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_98.data._M_elems._32_5_ = SUB85(uVar4,0);
                  local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_98.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_98.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_98.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_98.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_98.exp = pcVar20->exp;
                  local_98.neg = pcVar20->neg;
                  local_98.fpclass = pcVar20->fpclass;
                  local_98.prec_elem = pcVar20->prec_elem;
                  pcVar16 = pcVar11;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (pcVar14,pcVar16);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar10->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar18)].m_backend,pcVar14);
                uVar17 = uVar17 - 1;
                lVar18 = lVar18 + -0x3c;
              } while (1 < uVar17);
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (pcVar14,0,(type *)0x0);
          iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar9[lVar18].m_backend,pcVar14);
          if (iVar13 != 0) goto LAB_00226f1c;
        }
        lVar18 = local_58 + 1;
      } while ((int)lVar18 <
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    }
    local_50._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
    if (local_50.theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_50.theelem);
    }
  }
  else {
    pnVar3 = (activity->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar9 = (activity->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar9 != pnVar3; pnVar9 = pnVar9 + 1)
    {
      (pnVar9->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar9->m_backend).prec_elem = 10;
      (pnVar9->m_backend).data._M_elems[0] = 0;
      (pnVar9->m_backend).data._M_elems[1] = 0;
      (pnVar9->m_backend).data._M_elems[2] = 0;
      (pnVar9->m_backend).data._M_elems[3] = 0;
      (pnVar9->m_backend).data._M_elems[4] = 0;
      (pnVar9->m_backend).data._M_elems[5] = 0;
      (pnVar9->m_backend).data._M_elems[6] = 0;
      (pnVar9->m_backend).data._M_elems[7] = 0;
      *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x1d) = 0;
      *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x25) = 0;
    }
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::computePrimalActivity(const VectorBase<R>& primal, VectorBase<R>& activity,
      const bool unscaled) const
{
   if(primal.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP01 Primal vector for computing row activity has wrong dimension");

   if(activity.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP03 Activity vector computing row activity has wrong dimension");

   int c;

   for(c = 0; c < nCols() && primal[c] == 0; c++)
      ;

   if(c >= nCols())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nRows());

   if(unscaled && _isScaled)
   {
      lp_scaler->getColUnscaled(*this, c, tmp);
      activity = tmp;
   }
   else
      activity = colVector(c);

   activity *= primal[c];
   c++;

   for(; c < nCols(); c++)
   {
      if(primal[c] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getColUnscaled(*this, c, tmp);
            activity.multAdd(primal[c], tmp);
         }
         else
            activity.multAdd(primal[c], colVector(c));
      }
   }
}